

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O1

Error * ot::commissioner::RestoreFilePath(Error *__return_storage_ptr__,string *aPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ErrorCode EVar3;
  bool bVar4;
  string dirName;
  Error error;
  string baseName;
  string local_150;
  ErrorCode local_130;
  char *local_128;
  size_type local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  string local_108;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  char local_d8 [8];
  char local_d0 [16];
  string local_c0;
  string local_a0;
  Error local_80 [2];
  
  local_130 = kNone;
  local_120 = 0;
  local_118 = '\0';
  pcVar2 = (aPath->_M_dataplus)._M_p;
  local_128 = &local_118;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + aPath->_M_string_length);
  PathExists(local_80,&local_a0);
  EVar3 = local_80[0].mCode;
  paVar1 = &local_80[0].mMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80[0].mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_80[0].mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (EVar3 == kNone) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
    goto LAB_00278cc3;
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  SplitPath(aPath,&local_150,&local_108);
  if (local_150._M_string_length == 0) {
    bVar4 = false;
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    PathExists(local_80,&local_c0);
    bVar4 = local_80[0].mCode != kNone;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80[0].mMessage._M_dataplus._M_p != paVar1) {
      operator_delete(local_80[0].mMessage._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (bVar4) {
    RestoreDirPath((Error *)local_e8,&local_150);
    local_130 = local_e8._0_4_;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_e0);
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    if (local_130 == kNone) goto LAB_00278c2c;
    __return_storage_ptr__->mCode = local_130;
    paVar1 = &(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_128 == &local_118) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_117,local_118);
      *(undefined8 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uStack_110;
    }
    else {
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p = local_128;
      (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
           CONCAT71(uStack_117,local_118);
    }
    (__return_storage_ptr__->mMessage)._M_string_length = local_120;
    local_120 = 0;
    local_118 = '\0';
    local_128 = &local_118;
  }
  else {
LAB_00278c2c:
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
    WriteFile(__return_storage_ptr__,(string *)local_e8,aPath);
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
LAB_00278cc3:
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

Error RestoreFilePath(const std::string &aPath)
{
    Error error;
    if (PathExists(aPath).GetCode() != ErrorCode::kNone)
    {
        std::string dirName, baseName;
        SplitPath(aPath, dirName, baseName);

        if (!dirName.empty() && (PathExists(dirName).GetCode() != ErrorCode::kNone))
        {
            error = RestoreDirPath(dirName);
            if (error != ERROR_NONE)
            {
                return error;
            }
        }

        // Attempt to create empty file
        return WriteFile("", aPath);
    }

    return ERROR_NONE;
}